

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_usingDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,char *dictStart,
              int dictSize)

{
  ushort *puVar1;
  BYTE *pBVar2;
  undefined8 *puVar3;
  byte bVar4;
  BYTE BVar5;
  undefined8 uVar6;
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  char *pcVar12;
  BYTE *pBVar13;
  ushort *puVar14;
  int iVar15;
  ushort *puVar16;
  BYTE *pBVar17;
  char cVar18;
  uint uVar19;
  long lVar20;
  ushort *puVar21;
  long lVar22;
  BYTE *pBVar23;
  ulong uVar24;
  byte *pbVar25;
  byte *pbVar26;
  BYTE *pBVar27;
  long lVar28;
  BYTE *pBVar29;
  BYTE *pBVar30;
  ushort *puVar31;
  size_t prefixSize;
  ushort *puVar32;
  ushort *puVar33;
  BYTE *unaff_R12;
  BYTE *pBVar34;
  ushort *puVar35;
  ulong uVar36;
  ulong uStack_c0;
  ulong uStack_90;
  BYTE *pBStack_80;
  int iStack_68;
  
  iVar10 = (int)dest;
  iStack_68 = (int)source;
  if (dictSize == 0) {
    puVar35 = (ushort *)0xffffffffffffffff;
    if (source != (char *)0x0) {
      if (maxOutputSize == 0) {
        if (compressedSize == 1) {
          puVar35 = (ushort *)(ulong)-(uint)(*source != '\0');
        }
      }
      else if (compressedSize != 0) {
        puVar1 = (ushort *)(source + compressedSize);
        pBVar2 = (BYTE *)(dest + maxOutputSize);
        pBVar34 = (BYTE *)dest;
        puVar35 = (ushort *)source;
        if (maxOutputSize < 0x40) goto LAB_00102747;
        puVar14 = (ushort *)((long)puVar1 - 0xf);
        puVar33 = (ushort *)source;
LAB_001022c5:
        bVar4 = (byte)*puVar33;
        uVar9 = (uint)bVar4;
        puVar21 = (ushort *)((long)puVar33 + 1);
        uVar24 = (ulong)(uint)(bVar4 >> 4);
        puVar35 = puVar21;
        if (bVar4 >> 4 == 0xf) {
          uVar24 = 0xf;
          if (puVar21 < puVar14) {
            uVar19 = 0;
            do {
              uVar7 = *puVar35;
              puVar35 = (ushort *)((long)puVar35 + 1);
              uVar19 = uVar19 + (byte)uVar7;
            } while (puVar35 < puVar14 && (byte)uVar7 == 0xff);
            uVar24 = (ulong)uVar19 + 0xf;
          }
          pBVar13 = pBVar34 + uVar24;
          if (((puVar14 <= puVar21) || (CARRY8((ulong)pBVar34,uVar24))) ||
             (CARRY8((ulong)puVar35,uVar24))) {
            iVar15 = 5;
            pBVar13 = pBVar34;
          }
          else {
            unaff_R12 = pBVar13;
            if ((pBVar2 + -0x20 < pBVar13) || (puVar1 + -0x10 < (ushort *)((long)puVar35 + uVar24)))
            {
              iVar15 = 6;
              pBVar13 = pBVar34;
            }
            else {
              lVar22 = 0;
              do {
                uVar6 = *(undefined8 *)((byte *)((long)puVar35 + lVar22) + 8);
                pBVar27 = pBVar34 + lVar22;
                *(undefined8 *)pBVar27 = *(undefined8 *)((long)puVar35 + lVar22);
                *(undefined8 *)(pBVar27 + 8) = uVar6;
                pbVar25 = (byte *)((long)puVar35 + lVar22 + 0x10);
                uVar6 = *(undefined8 *)(pbVar25 + 8);
                *(undefined8 *)(pBVar27 + 0x10) = *(undefined8 *)pbVar25;
                *(undefined8 *)(pBVar27 + 0x18) = uVar6;
                lVar22 = lVar22 + 0x20;
              } while (pBVar27 + 0x20 < pBVar13);
              iVar15 = 0;
              puVar35 = (ushort *)((long)puVar35 + uVar24);
            }
          }
          if (iVar15 != 0) {
            if (iVar15 != 5) {
              pBVar34 = pBVar13;
              if (iVar15 == 6) goto LAB_00102647;
              goto LAB_00102802;
            }
            goto LAB_001027fa;
          }
        }
        else {
          pBVar13 = pBVar34 + uVar24;
          unaff_R12 = pBVar13;
          if ((ushort *)((long)puVar1 - 0x11U) < puVar21) goto LAB_00102647;
          uVar6 = *(undefined8 *)((long)puVar33 + 9);
          *(undefined8 *)pBVar34 = *(undefined8 *)puVar21;
          *(undefined8 *)(pBVar34 + 8) = uVar6;
          puVar35 = (ushort *)(uVar24 + (long)puVar21);
        }
        uVar7 = *puVar35;
        uVar36 = (ulong)uVar7;
        puVar35 = puVar35 + 1;
        pBVar27 = pBVar13 + -uVar36;
        uVar24 = (ulong)(bVar4 & 0xf);
        if (uVar24 == 0xf) {
          if (pBVar27 < dest) {
            iVar15 = 5;
            pBStack_80 = (BYTE *)0xf;
          }
          else {
            uVar9 = 0;
            do {
              uVar8 = *puVar35;
              puVar35 = (ushort *)((long)puVar35 + 1);
              uVar9 = uVar9 + (byte)uVar8;
            } while ((byte)uVar8 == 0xff && puVar35 < puVar1 + -2);
            uVar24 = (ulong)uVar9;
            pBStack_80 = (BYTE *)(uVar24 + 0xf);
            if ((puVar1 + -2 <= puVar35) || (CARRY8((ulong)pBVar13,(ulong)pBStack_80))) {
              iVar15 = 5;
            }
            else {
              pBStack_80 = (BYTE *)(uVar24 + 0x13);
              iVar15 = 7;
              if (pBVar13 + uVar24 + 0x13 < pBVar2 + -0x40) {
                iVar15 = 0;
              }
            }
          }
          if (iVar15 != 0) {
            if (iVar15 != 5) {
              if (iVar15 != 7) goto LAB_00102802;
              goto LAB_001026e9;
            }
            goto LAB_001027fa;
          }
LAB_00102456:
          if (pBVar27 < dest) goto LAB_001027fa;
          unaff_R12 = pBVar13 + (long)pBStack_80;
          pBVar34 = unaff_R12;
          puVar33 = puVar35;
          if (uVar7 < 0x10) {
            LZ4_memcpy_using_offset(pBVar13,pBVar27,unaff_R12,uVar36);
          }
          else {
            do {
              uVar6 = *(undefined8 *)(pBVar13 + -uVar36 + 8);
              *(undefined8 *)pBVar13 = *(undefined8 *)(pBVar13 + -uVar36);
              *(undefined8 *)(pBVar13 + 8) = uVar6;
              uVar6 = *(undefined8 *)(pBVar13 + -uVar36 + 0x10 + 8);
              *(undefined8 *)(pBVar13 + 0x10) = *(undefined8 *)(pBVar13 + -uVar36 + 0x10);
              *(undefined8 *)(pBVar13 + 0x18) = uVar6;
              pBVar13 = pBVar13 + 0x20;
            } while (pBVar13 < unaff_R12);
          }
        }
        else {
          pBStack_80 = (BYTE *)(uVar24 + 4);
          if (pBVar2 + -0x40 <= pBVar13 + uVar24 + 4) goto LAB_001026e9;
          if ((pBVar27 < dest) || (uVar7 < 8)) goto LAB_00102456;
          *(undefined8 *)pBVar13 = *(undefined8 *)pBVar27;
          *(undefined8 *)(pBVar13 + 8) = *(undefined8 *)(pBVar27 + 8);
          *(undefined2 *)(pBVar13 + 0x10) = *(undefined2 *)(pBVar27 + 0x10);
          pBVar34 = pBVar13 + uVar24 + 4;
          puVar33 = puVar35;
        }
        goto LAB_001022c5;
      }
    }
    goto LAB_00102802;
  }
  prefixSize = (size_t)dictSize;
  if (dictStart + prefixSize == dest) {
    if (dictSize < 0xffff) {
      iVar10 = LZ4_decompress_safe_withSmallPrefix
                         (source,dest,compressedSize,maxOutputSize,prefixSize);
      return iVar10;
    }
    puVar35 = (ushort *)0xffffffffffffffff;
    if (source != (char *)0x0) {
      if (maxOutputSize == 0) {
        if (compressedSize == 1) {
          puVar35 = (ushort *)(ulong)-(uint)(*source != '\0');
        }
      }
      else if (compressedSize != 0) {
        puVar1 = (ushort *)(source + compressedSize);
        puVar14 = (ushort *)(dest + maxOutputSize);
        puVar33 = (ushort *)dest;
        puVar35 = (ushort *)source;
        if (maxOutputSize < 0x40) goto LAB_00103492;
        puVar21 = (ushort *)((long)puVar1 + -0xf);
        lVar22 = 0;
        puVar33 = (ushort *)(source + (long)compressedSize + -0x10);
        puVar16 = (ushort *)source;
LAB_00102fa5:
        puVar32 = puVar33;
        iVar15 = 5;
        puVar33 = (ushort *)(dest + lVar22);
        bVar4 = (byte)*puVar16;
        uVar9 = (uint)bVar4;
        puVar35 = (ushort *)((long)puVar16 + 1);
        uVar24 = (ulong)(uint)(bVar4 >> 4);
        if (bVar4 >> 4 == 0xf) {
          uVar24 = 0xf;
          puVar16 = puVar35;
          if (puVar35 < puVar21) {
            uVar19 = 0;
            do {
              uVar7 = *puVar16;
              puVar16 = (ushort *)((long)puVar16 + 1);
              uVar19 = uVar19 + (byte)uVar7;
            } while (puVar16 < puVar21 && (byte)uVar7 == 0xff);
            uVar24 = (ulong)uVar19 + 0xf;
          }
          lVar28 = lVar22;
          if (((puVar35 < puVar21) && (!CARRY8((ulong)puVar33,uVar24))) &&
             (!CARRY8((ulong)puVar16,uVar24))) {
            puVar32 = (ushort *)(dest + lVar22 + uVar24);
            if ((puVar14 + -0x10 < puVar32) || (puVar1 + -0x10 < (ushort *)((long)puVar16 + uVar24))
               ) {
              iVar15 = 6;
            }
            else {
              lVar28 = 0;
              do {
                uVar6 = *(undefined8 *)((byte *)((long)puVar16 + lVar28) + 8);
                pbVar25 = (byte *)((long)puVar33 + lVar28);
                *(undefined8 *)pbVar25 = *(undefined8 *)((long)puVar16 + lVar28);
                *(undefined8 *)(pbVar25 + 8) = uVar6;
                pbVar26 = (byte *)((long)puVar16 + lVar28 + 0x10);
                uVar6 = *(undefined8 *)(pbVar26 + 8);
                *(undefined8 *)(pbVar25 + 0x10) = *(undefined8 *)pbVar26;
                *(undefined8 *)(pbVar25 + 0x18) = uVar6;
                lVar28 = lVar28 + 0x20;
              } while (pbVar25 + 0x20 < puVar32);
              iVar15 = 0;
              puVar16 = (ushort *)((long)puVar16 + uVar24);
              lVar28 = lVar22 + uVar24;
            }
          }
          puVar33 = puVar32;
          if (iVar15 != 0) {
            if (iVar15 == 5) goto LAB_00103568;
            if (iVar15 != 6) goto LAB_0010327f;
            puVar33 = (ushort *)(dest + lVar28);
            puVar35 = puVar16;
LAB_00103389:
            while ((puVar21 = (ushort *)((long)puVar35 + uVar24), puVar32 <= puVar14 + -6 &&
                   (puVar21 <= puVar1 + -4))) {
              do {
                *(undefined8 *)puVar33 = *(undefined8 *)puVar35;
                puVar33 = puVar33 + 4;
                puVar35 = puVar35 + 4;
              } while (puVar33 < puVar32);
              uVar36 = (ulong)*puVar21;
              puVar35 = puVar21 + 1;
              pbVar25 = (byte *)((long)puVar32 - uVar36);
              uStack_90 = (ulong)(uVar9 & 0xf);
LAB_001033d6:
              if ((int)uStack_90 == 0xf) {
                uVar9 = 0;
                do {
                  uVar7 = *puVar35;
                  puVar35 = (ushort *)((long)puVar35 + 1);
                  uVar9 = uVar9 + (byte)uVar7;
                } while (puVar35 < puVar1 + -2 && (byte)uVar7 == 0xff);
                uStack_90 = (ulong)uVar9 + 0xf;
                cVar18 = '\x05';
                if (puVar35 < puVar1 + -2) {
                  cVar18 = CARRY8((ulong)puVar32,uStack_90) * '\x05';
                }
                if (cVar18 != '\0') {
                  puVar16 = puVar35;
                  if (cVar18 == '\x05') goto LAB_00103568;
                  goto LAB_0010327f;
                }
              }
              uStack_90 = uStack_90 + 4;
LAB_0010342c:
              puVar16 = puVar35;
              if (pbVar25 < dest + -0x10000) goto LAB_00103568;
              puVar33 = (ushort *)((long)puVar32 + uStack_90);
              if ((uint)uVar36 < 8) {
                puVar32[0] = 0;
                puVar32[1] = 0;
                *(byte *)puVar32 = *pbVar25;
                *(byte *)((long)puVar32 + 1) = pbVar25[1];
                *(byte *)(puVar32 + 1) = pbVar25[2];
                *(byte *)((long)puVar32 + 3) = pbVar25[3];
                uVar24 = (ulong)((uint)uVar36 << 2);
                uVar36 = (ulong)*(uint *)((long)inc32table + uVar24);
                *(undefined4 *)(puVar32 + 2) = *(undefined4 *)(pbVar25 + uVar36);
                pbVar25 = pbVar25 + (uVar36 - (long)*(int *)((long)dec64table + uVar24));
              }
              else {
                *(undefined8 *)puVar32 = *(undefined8 *)pbVar25;
                pbVar25 = pbVar25 + 8;
              }
              puVar21 = puVar32 + 4;
              if (puVar14 + -6 < puVar33) {
                iVar15 = 5;
                if (puVar33 <= (ushort *)((long)puVar14 + -5)) {
                  puVar32 = (ushort *)((long)puVar14 + -7);
                  pbVar26 = pbVar25;
                  puVar31 = puVar21;
                  if (puVar21 < puVar32) {
                    do {
                      *(undefined8 *)puVar31 = *(undefined8 *)pbVar26;
                      puVar31 = puVar31 + 4;
                      pbVar26 = pbVar26 + 8;
                    } while (puVar31 < puVar32);
                    pbVar25 = pbVar25 + ((long)puVar32 - (long)puVar21);
                    puVar21 = puVar32;
                  }
                  iVar15 = 0;
                  for (; puVar21 < puVar33; puVar21 = (ushort *)((long)puVar21 + 1)) {
                    bVar4 = *pbVar25;
                    pbVar25 = pbVar25 + 1;
                    *(byte *)puVar21 = bVar4;
                  }
                }
                if (iVar15 != 0) {
                  if (iVar15 == 5) goto LAB_00103568;
                  goto LAB_0010327f;
                }
              }
              else {
                *(undefined8 *)puVar21 = *(undefined8 *)pbVar25;
                if (0x10 < uStack_90) {
                  puVar32 = puVar32 + 8;
                  do {
                    pbVar25 = pbVar25 + 8;
                    *(undefined8 *)puVar32 = *(undefined8 *)pbVar25;
                    puVar32 = puVar32 + 4;
                  } while (puVar32 < puVar33);
                }
              }
LAB_00103492:
              bVar4 = (byte)*puVar35;
              puVar21 = (ushort *)((long)puVar35 + 1);
LAB_00103291:
              uVar9 = (uint)bVar4;
              if (bVar4 >> 4 != 0xf) {
                uVar24 = (ulong)(uint)(bVar4 >> 4);
                if ((source + (long)compressedSize + -0x10 <= puVar21) ||
                   (dest + (long)maxOutputSize + -0x20 < puVar33)) goto LAB_00103385;
                uVar6 = *(undefined8 *)(puVar21 + 4);
                *(undefined8 *)puVar33 = *(undefined8 *)puVar21;
                *(undefined8 *)(puVar33 + 4) = uVar6;
                puVar32 = (ushort *)((long)puVar33 + uVar24);
                uStack_90 = (ulong)(uVar9 & 0xf);
                puVar35 = (ushort *)((long)puVar21 + uVar24) + 1;
                uVar7 = *(ushort *)((long)puVar21 + uVar24);
                uVar36 = (ulong)uVar7;
                pbVar25 = (byte *)((long)puVar32 - uVar36);
                if (((uVar9 & 0xf) != 0xf) && (7 < uVar7)) goto code_r0x001032e6;
                goto LAB_001033d6;
              }
              puVar35 = (ushort *)((long)puVar1 + -0xf);
              uVar24 = 0xf;
              puVar16 = puVar21;
              if (puVar21 < puVar35) {
                uVar19 = 0;
                do {
                  uVar7 = *puVar16;
                  puVar16 = (ushort *)((long)puVar16 + 1);
                  uVar19 = uVar19 + (byte)uVar7;
                } while (puVar16 < puVar35 && (byte)uVar7 == 0xff);
                uVar24 = (ulong)uVar19 + 0xf;
              }
              if (((puVar35 <= puVar21) || (CARRY8((ulong)puVar33,uVar24))) ||
                 (puVar21 = puVar16, CARRY8((ulong)puVar16,uVar24))) goto LAB_00103568;
LAB_00103385:
              puVar32 = (ushort *)((long)puVar33 + uVar24);
              puVar35 = puVar21;
            }
            puVar16 = puVar35;
            if ((puVar21 == puVar1) && (puVar32 <= puVar14)) {
              memmove(puVar33,puVar35,uVar24);
              puVar35 = (ushort *)(ulong)(uint)(((int)puVar33 + (int)uVar24) - iVar10);
            }
            else {
LAB_00103568:
              puVar35 = (ushort *)(ulong)(~(uint)puVar16 + iStack_68);
            }
            goto LAB_0010327f;
          }
        }
        else {
          lVar28 = lVar22 + uVar24;
          puVar32 = (ushort *)(dest + lVar28);
          if ((ushort *)((long)puVar1 + -0x11) < puVar35) goto LAB_00103389;
          uVar6 = *(undefined8 *)((long)puVar16 + 9);
          *(undefined8 *)puVar33 = *(undefined8 *)puVar35;
          *(undefined8 *)(puVar33 + 4) = uVar6;
          puVar16 = (ushort *)(uVar24 + (long)puVar35);
          puVar33 = puVar32;
        }
        puVar32 = (ushort *)(dest + lVar28);
        uVar7 = *puVar16;
        uVar36 = (ulong)uVar7;
        puVar35 = puVar16 + 1;
        lVar20 = lVar28 - uVar36;
        pbVar25 = (byte *)(dest + lVar20);
        uStack_90 = (ulong)(bVar4 & 0xf);
        if (uStack_90 == 0xf) {
          if (lVar20 < -0x10000) {
            iVar15 = 5;
            uStack_90 = 0xf;
          }
          else {
            uVar9 = 0;
            do {
              uVar8 = *puVar35;
              puVar35 = (ushort *)((long)puVar35 + 1);
              uVar9 = uVar9 + (byte)uVar8;
            } while ((byte)uVar8 == 0xff && puVar35 < puVar1 + -2);
            uVar24 = (ulong)uVar9;
            uStack_90 = uVar24 + 0xf;
            if ((puVar1 + -2 <= puVar35) || (CARRY8((ulong)puVar32,uStack_90))) {
              iVar15 = 5;
            }
            else {
              uStack_90 = uVar24 + 0x13;
              iVar15 = 7;
              if ((ushort *)((long)puVar32 + uVar24 + 0x13) < puVar14 + -0x20) {
                iVar15 = 0;
              }
            }
          }
          if (iVar15 != 0) {
            puVar16 = puVar35;
            if (iVar15 != 5) {
              if (iVar15 == 7) goto LAB_0010342c;
              goto LAB_0010327f;
            }
            goto LAB_00103568;
          }
LAB_0010315c:
          puVar16 = puVar35;
          if (lVar20 < -0x10000) goto LAB_00103568;
          lVar22 = lVar28 + uStack_90;
          puVar33 = (ushort *)(dest + lVar22);
          if (uVar7 < 0x10) {
            LZ4_memcpy_using_offset((BYTE *)puVar32,pbVar25,(BYTE *)puVar33,uVar36);
          }
          else {
            do {
              puVar3 = (undefined8 *)((long)puVar32 + -uVar36);
              uVar6 = puVar3[1];
              *(undefined8 *)puVar32 = *puVar3;
              *(undefined8 *)(puVar32 + 4) = uVar6;
              pbVar25 = (byte *)((long)puVar32 + -uVar36 + 0x10);
              uVar6 = *(undefined8 *)(pbVar25 + 8);
              *(undefined8 *)(puVar32 + 8) = *(undefined8 *)pbVar25;
              *(undefined8 *)(puVar32 + 0xc) = uVar6;
              puVar32 = puVar32 + 0x10;
            } while (puVar32 < puVar33);
          }
        }
        else {
          lVar22 = lVar28 + uStack_90 + 4;
          uStack_90 = uStack_90 + 4;
          if (puVar14 + -0x20 <= dest + lVar22) goto LAB_0010342c;
          if (uVar7 < 8) goto LAB_0010315c;
          *(undefined8 *)puVar32 = *(undefined8 *)pbVar25;
          *(undefined8 *)(puVar32 + 4) = *(undefined8 *)(pbVar25 + 8);
          puVar32[8] = *(ushort *)(pbVar25 + 0x10);
          puVar16 = puVar35;
        }
        goto LAB_00102fa5;
      }
    }
LAB_0010327f:
    return (int)puVar35;
  }
  puVar35 = (ushort *)0xffffffffffffffff;
  if (source != (char *)0x0) {
    pcVar12 = dictStart + prefixSize;
    if (dictStart == (char *)0x0) {
      pcVar12 = (char *)0x0;
    }
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        puVar35 = (ushort *)(ulong)-(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      puVar1 = (ushort *)(source + compressedSize);
      pBVar2 = (BYTE *)(dest + maxOutputSize);
      puVar35 = (ushort *)source;
      pBVar34 = (BYTE *)dest;
      if (maxOutputSize < 0x40) goto LAB_00103d09;
      puVar14 = (ushort *)((long)puVar1 - 0xf);
      puVar33 = (ushort *)source;
LAB_001036a2:
      bVar4 = (byte)*puVar33;
      uVar9 = (uint)bVar4;
      puVar21 = (ushort *)((long)puVar33 + 1);
      uVar24 = (ulong)(uint)(bVar4 >> 4);
      puVar35 = puVar21;
      if (bVar4 >> 4 == 0xf) {
        uVar24 = 0xf;
        if (puVar21 < puVar14) {
          uVar19 = 0;
          do {
            uVar7 = *puVar35;
            puVar35 = (ushort *)((long)puVar35 + 1);
            uVar19 = uVar19 + (byte)uVar7;
          } while (puVar35 < puVar14 && (byte)uVar7 == 0xff);
          uVar24 = (ulong)uVar19 + 0xf;
        }
        pBVar13 = pBVar34 + uVar24;
        if (((puVar14 <= puVar21) || (CARRY8((ulong)pBVar34,uVar24))) ||
           (CARRY8((ulong)puVar35,uVar24))) {
          iVar15 = 5;
        }
        else {
          pBStack_80 = pBVar13;
          if ((pBVar2 + -0x20 < pBVar13) || (puVar1 + -0x10 < (ushort *)((long)puVar35 + uVar24))) {
            iVar15 = 6;
          }
          else {
            lVar22 = 0;
            do {
              uVar6 = *(undefined8 *)((byte *)((long)puVar35 + lVar22) + 8);
              pBVar27 = pBVar34 + lVar22;
              *(undefined8 *)pBVar27 = *(undefined8 *)((long)puVar35 + lVar22);
              *(undefined8 *)(pBVar27 + 8) = uVar6;
              pbVar25 = (byte *)((long)puVar35 + lVar22 + 0x10);
              uVar6 = *(undefined8 *)(pbVar25 + 8);
              *(undefined8 *)(pBVar27 + 0x10) = *(undefined8 *)pbVar25;
              *(undefined8 *)(pBVar27 + 0x18) = uVar6;
              lVar22 = lVar22 + 0x20;
            } while (pBVar27 + 0x20 < pBVar13);
            iVar15 = 0;
            puVar35 = (ushort *)((long)puVar35 + uVar24);
            pBVar34 = pBVar13;
          }
        }
        pBVar13 = pBVar34;
        if (iVar15 != 0) {
          if (iVar15 != 5) {
            if (iVar15 == 6) goto LAB_00103b29;
            goto LAB_00103ddd;
          }
          goto LAB_00103dd5;
        }
      }
      else {
        pBStack_80 = pBVar34 + uVar24;
        if ((ushort *)((long)puVar1 - 0x11U) < puVar21) goto LAB_00103b29;
        uVar6 = *(undefined8 *)((long)puVar33 + 9);
        *(undefined8 *)pBVar34 = *(undefined8 *)puVar21;
        *(undefined8 *)(pBVar34 + 8) = uVar6;
        puVar35 = (ushort *)(uVar24 + (long)puVar21);
        pBVar13 = pBStack_80;
      }
      uVar7 = *puVar35;
      uVar36 = (ulong)uVar7;
      puVar35 = puVar35 + 1;
      pBVar27 = pBVar13 + -uVar36;
      uVar24 = (ulong)(bVar4 & 0xf);
      if (uVar24 == 0xf) {
        if ((prefixSize < 0x10000) && (pBVar27 + prefixSize < dest)) {
          iVar15 = 5;
          uStack_c0 = 0xf;
        }
        else {
          uVar9 = 0;
          do {
            uVar8 = *puVar35;
            puVar35 = (ushort *)((long)puVar35 + 1);
            uVar9 = uVar9 + (byte)uVar8;
          } while ((byte)uVar8 == 0xff && puVar35 < puVar1 + -2);
          uVar24 = (ulong)uVar9;
          uStack_c0 = uVar24 + 0xf;
          if ((puVar1 + -2 <= puVar35) || (CARRY8((ulong)pBVar13,uStack_c0))) {
            iVar15 = 5;
          }
          else {
            uStack_c0 = uVar24 + 0x13;
            iVar15 = 7;
            if (pBVar13 + uVar24 + 0x13 < pBVar2 + -0x40) {
              iVar15 = 0;
            }
          }
        }
        if (iVar15 != 0) {
          if (iVar15 != 5) {
            if (iVar15 == 7) goto LAB_00103bd1;
            goto LAB_00103ddd;
          }
          goto LAB_00103dd5;
        }
      }
      else {
        uStack_c0 = uVar24 + 4;
        if (pBVar2 + -0x40 <= pBVar13 + uVar24 + 4) goto LAB_00103bd1;
        if ((dest <= pBVar27) && (7 < uVar7)) {
          *(undefined8 *)pBVar13 = *(undefined8 *)pBVar27;
          *(undefined8 *)(pBVar13 + 8) = *(undefined8 *)(pBVar27 + 8);
          *(undefined2 *)(pBVar13 + 0x10) = *(undefined2 *)(pBVar27 + 0x10);
          puVar33 = puVar35;
          pBVar34 = pBVar13 + uVar24 + 4;
          goto LAB_001036a2;
        }
      }
      if ((prefixSize < 0x10000) && (pBVar27 + prefixSize < dest)) goto LAB_00103dd5;
      pBVar23 = pBVar13 + uStack_c0;
      puVar33 = puVar35;
      pBVar34 = pBVar23;
      if (pBVar27 < dest) {
        if (pBVar2 + -5 < pBVar23) goto LAB_00103dd5;
        uVar24 = (long)dest - (long)pBVar27;
        uVar36 = uStack_c0 - uVar24;
        if (uStack_c0 < uVar24 || uVar36 == 0) {
          memmove(pBVar13,pcVar12 + -uVar24,uStack_c0);
        }
        else {
          memcpy(pBVar13,pcVar12 + -uVar24,uVar24);
          pBVar34 = pBVar13 + uVar24;
          if ((ulong)((long)pBVar34 - (long)dest) < uVar36) {
            pBVar13 = (BYTE *)dest;
            if ((long)uVar24 < (long)uStack_c0) {
              do {
                *pBVar34 = *pBVar13;
                pBVar34 = pBVar34 + 1;
                pBVar13 = pBVar13 + 1;
              } while (pBVar34 < pBVar23);
            }
          }
          else {
            memcpy(pBVar34,dest,uVar36);
            pBVar34 = pBVar23;
          }
        }
      }
      else {
        pBStack_80 = pBVar23;
        if (uVar7 < 0x10) {
          LZ4_memcpy_using_offset(pBVar13,pBVar27,pBVar23,uVar36);
        }
        else {
          do {
            uVar6 = *(undefined8 *)(pBVar13 + -uVar36 + 8);
            *(undefined8 *)pBVar13 = *(undefined8 *)(pBVar13 + -uVar36);
            *(undefined8 *)(pBVar13 + 8) = uVar6;
            uVar6 = *(undefined8 *)(pBVar13 + -uVar36 + 0x10 + 8);
            *(undefined8 *)(pBVar13 + 0x10) = *(undefined8 *)(pBVar13 + -uVar36 + 0x10);
            *(undefined8 *)(pBVar13 + 0x18) = uVar6;
            pBVar13 = pBVar13 + 0x20;
          } while (pBVar13 < pBVar23);
        }
      }
      goto LAB_001036a2;
    }
  }
  goto LAB_00103ddd;
LAB_001026e9:
  if (pBVar27 < dest) goto LAB_001027fa;
  pBVar34 = pBVar13 + (long)pBStack_80;
  if ((uint)uVar36 < 8) {
    pBVar13[0] = '\0';
    pBVar13[1] = '\0';
    pBVar13[2] = '\0';
    pBVar13[3] = '\0';
    *pBVar13 = *pBVar27;
    pBVar13[1] = pBVar27[1];
    pBVar13[2] = pBVar27[2];
    pBVar13[3] = pBVar27[3];
    uVar24 = (ulong)((uint)uVar36 << 2);
    uVar36 = (ulong)*(uint *)((long)inc32table + uVar24);
    *(undefined4 *)(pBVar13 + 4) = *(undefined4 *)(pBVar27 + uVar36);
    pBVar27 = pBVar27 + (uVar36 - (long)*(int *)((long)dec64table + uVar24));
  }
  else {
    *(undefined8 *)pBVar13 = *(undefined8 *)pBVar27;
    pBVar27 = pBVar27 + 8;
  }
  pBVar23 = pBVar13 + 8;
  if (pBVar2 + -0xc < pBVar34) {
    iVar15 = 5;
    if (pBVar34 <= pBVar2 + -5) {
      pBVar13 = pBVar2 + -7;
      pBVar17 = pBVar27;
      pBVar30 = pBVar23;
      if (pBVar23 < pBVar13) {
        do {
          *(undefined8 *)pBVar30 = *(undefined8 *)pBVar17;
          pBVar30 = pBVar30 + 8;
          pBVar17 = pBVar17 + 8;
        } while (pBVar30 < pBVar13);
        pBVar27 = pBVar27 + ((long)pBVar13 - (long)pBVar23);
        pBVar23 = pBVar13;
      }
      iVar15 = 0;
      for (; pBVar23 < pBVar34; pBVar23 = pBVar23 + 1) {
        BVar5 = *pBVar27;
        pBVar27 = pBVar27 + 1;
        *pBVar23 = BVar5;
      }
    }
    if (iVar15 != 0) {
      if (iVar15 != 5) goto LAB_00102802;
      goto LAB_001027fa;
    }
  }
  else {
    *(undefined8 *)pBVar23 = *(undefined8 *)pBVar27;
    if (0x10 < pBStack_80) {
      pBVar13 = pBVar13 + 0x10;
      do {
        pBVar27 = pBVar27 + 8;
        *(undefined8 *)pBVar13 = *(undefined8 *)pBVar27;
        pBVar13 = pBVar13 + 8;
      } while (pBVar13 < pBVar34);
    }
  }
LAB_00102747:
  bVar4 = (byte)*puVar35;
  puVar14 = (ushort *)((long)puVar35 + 1);
  while( true ) {
    uVar9 = (uint)bVar4;
    if (bVar4 >> 4 == 0xf) break;
    uVar24 = (ulong)(uint)(bVar4 >> 4);
    if ((source + (long)compressedSize + -0x10 <= puVar14) ||
       (dest + (long)maxOutputSize + -0x20 < pBVar34)) goto LAB_00102641;
    uVar6 = *(undefined8 *)(puVar14 + 4);
    *(undefined8 *)pBVar34 = *(undefined8 *)puVar14;
    *(undefined8 *)(pBVar34 + 8) = uVar6;
    unaff_R12 = pBVar34 + uVar24;
    uVar11 = (ulong)(uVar9 & 0xf);
    puVar35 = (ushort *)((long)puVar14 + uVar24) + 1;
    uVar7 = *(ushort *)((long)puVar14 + uVar24);
    uVar36 = (ulong)uVar7;
    pBVar27 = unaff_R12 + -uVar36;
    if ((((uVar9 & 0xf) == 0xf) || (uVar7 < 8)) || (pBVar27 < dest)) goto LAB_0010268c;
    *(undefined8 *)unaff_R12 = *(undefined8 *)pBVar27;
    *(undefined8 *)(unaff_R12 + 8) = *(undefined8 *)(pBVar27 + 8);
    *(undefined2 *)(unaff_R12 + 0x10) = *(undefined2 *)(pBVar27 + 0x10);
    pBVar34 = unaff_R12 + uVar11 + 4;
    bVar4 = *(byte *)((long)puVar14 + uVar24 + 2);
    puVar14 = (ushort *)((long)puVar14 + uVar24 + 3);
  }
  puVar33 = (ushort *)((long)puVar1 - 0xf);
  uVar24 = 0xf;
  puVar35 = puVar14;
  if (puVar14 < puVar33) {
    uVar19 = 0;
    do {
      uVar7 = *puVar35;
      puVar35 = (ushort *)((long)puVar35 + 1);
      uVar19 = uVar19 + (byte)uVar7;
    } while (puVar35 < puVar33 && (byte)uVar7 == 0xff);
    uVar24 = (ulong)uVar19 + 0xf;
  }
  if (((puVar33 <= puVar14) || (CARRY8((ulong)pBVar34,uVar24))) ||
     (puVar14 = puVar35, CARRY8((ulong)puVar35,uVar24))) goto LAB_001027fa;
LAB_00102641:
  unaff_R12 = pBVar34 + uVar24;
  puVar35 = puVar14;
LAB_00102647:
  puVar14 = (ushort *)((long)puVar35 + uVar24);
  if ((pBVar2 + -0xc < unaff_R12) || (puVar1 + -4 < puVar14)) {
    if ((puVar14 == puVar1) && (unaff_R12 <= pBVar2)) {
      memmove(pBVar34,puVar35,uVar24);
      puVar35 = (ushort *)(ulong)(uint)(((int)pBVar34 + (int)uVar24) - iVar10);
      goto LAB_00102802;
    }
    goto LAB_001027fa;
  }
  do {
    *(undefined8 *)pBVar34 = *(undefined8 *)puVar35;
    pBVar34 = pBVar34 + 8;
    puVar35 = puVar35 + 4;
  } while (pBVar34 < unaff_R12);
  uVar36 = (ulong)*puVar14;
  puVar35 = puVar14 + 1;
  pBVar27 = unaff_R12 + -uVar36;
  uVar11 = (ulong)(uVar9 & 0xf);
LAB_0010268c:
  if ((int)uVar11 == 0xf) {
    uVar9 = 0;
    do {
      uVar7 = *puVar35;
      puVar35 = (ushort *)((long)puVar35 + 1);
      uVar9 = uVar9 + (byte)uVar7;
    } while (puVar35 < puVar1 + -2 && (byte)uVar7 == 0xff);
    uVar11 = (ulong)uVar9 + 0xf;
    cVar18 = '\x05';
    if (puVar35 < puVar1 + -2) {
      cVar18 = CARRY8((ulong)unaff_R12,uVar11) * '\x05';
    }
    if (cVar18 != '\0') {
      if (cVar18 != '\x05') goto LAB_00102802;
      goto LAB_001027fa;
    }
  }
  pBStack_80 = (BYTE *)(uVar11 + 4);
  pBVar13 = unaff_R12;
  goto LAB_001026e9;
LAB_00103bd1:
  if ((prefixSize < 0x10000) && (pBVar27 + prefixSize < dest)) goto LAB_00103dd5;
  pBVar23 = pBVar13 + uStack_c0;
  pBVar34 = pBVar23;
  if (pBVar27 < dest) {
    if (pBVar2 + -5 < pBVar23) goto LAB_00103dd5;
    uVar24 = (long)dest - (long)pBVar27;
    uVar36 = uStack_c0 - uVar24;
    if (uStack_c0 < uVar24 || uVar36 == 0) {
      memmove(pBVar13,pcVar12 + -uVar24,uStack_c0);
    }
    else {
      memcpy(pBVar13,pcVar12 + -uVar24,uVar24);
      pBVar34 = pBVar13 + uVar24;
      if ((ulong)((long)pBVar34 - (long)dest) < uVar36) {
        pBVar13 = (BYTE *)dest;
        if ((long)uVar24 < (long)uStack_c0) {
          do {
            *pBVar34 = *pBVar13;
            pBVar34 = pBVar34 + 1;
            pBVar13 = pBVar13 + 1;
          } while (pBVar34 < pBVar23);
        }
      }
      else {
        memcpy(pBVar34,dest,uVar36);
        pBVar34 = pBVar23;
      }
    }
  }
  else {
    if ((uint)uVar36 < 8) {
      pBVar13[0] = '\0';
      pBVar13[1] = '\0';
      pBVar13[2] = '\0';
      pBVar13[3] = '\0';
      *pBVar13 = *pBVar27;
      pBVar13[1] = pBVar27[1];
      pBVar13[2] = pBVar27[2];
      pBVar13[3] = pBVar27[3];
      uVar24 = (ulong)((uint)uVar36 << 2);
      uVar36 = (ulong)*(uint *)((long)inc32table + uVar24);
      *(undefined4 *)(pBVar13 + 4) = *(undefined4 *)(pBVar27 + uVar36);
      pBVar27 = pBVar27 + (uVar36 - (long)*(int *)((long)dec64table + uVar24));
    }
    else {
      *(undefined8 *)pBVar13 = *(undefined8 *)pBVar27;
      pBVar27 = pBVar27 + 8;
    }
    pBVar17 = pBVar13 + 8;
    if (pBVar2 + -0xc < pBVar23) {
      iVar15 = 5;
      if (pBVar23 <= pBVar2 + -5) {
        pBVar13 = pBVar2 + -7;
        pBVar30 = pBVar27;
        pBVar29 = pBVar17;
        if (pBVar17 < pBVar13) {
          do {
            *(undefined8 *)pBVar29 = *(undefined8 *)pBVar30;
            pBVar29 = pBVar29 + 8;
            pBVar30 = pBVar30 + 8;
          } while (pBVar29 < pBVar13);
          pBVar27 = pBVar27 + ((long)pBVar13 - (long)pBVar17);
          pBVar17 = pBVar13;
        }
        iVar15 = 0;
        for (; pBVar17 < pBVar23; pBVar17 = pBVar17 + 1) {
          BVar5 = *pBVar27;
          pBVar27 = pBVar27 + 1;
          *pBVar17 = BVar5;
        }
      }
      if (iVar15 != 0) {
        if (iVar15 != 5) goto LAB_00103ddd;
        goto LAB_00103dd5;
      }
    }
    else {
      *(undefined8 *)pBVar17 = *(undefined8 *)pBVar27;
      if (0x10 < uStack_c0) {
        pBVar13 = pBVar13 + 0x10;
        do {
          pBVar27 = pBVar27 + 8;
          *(undefined8 *)pBVar13 = *(undefined8 *)pBVar27;
          pBVar13 = pBVar13 + 8;
        } while (pBVar13 < pBVar23);
      }
    }
  }
LAB_00103d09:
  bVar4 = (byte)*puVar35;
  puVar14 = (ushort *)((long)puVar35 + 1);
  while( true ) {
    uVar9 = (uint)bVar4;
    if (bVar4 >> 4 == 0xf) break;
    uVar24 = (ulong)(uint)(bVar4 >> 4);
    if ((source + (long)compressedSize + -0x10 <= puVar14) ||
       (dest + (long)maxOutputSize + -0x20 < pBVar34)) goto LAB_00103b22;
    uVar6 = *(undefined8 *)(puVar14 + 4);
    *(undefined8 *)pBVar34 = *(undefined8 *)puVar14;
    *(undefined8 *)(pBVar34 + 8) = uVar6;
    pBStack_80 = pBVar34 + uVar24;
    uStack_c0 = (ulong)(uVar9 & 0xf);
    puVar33 = (ushort *)((long)puVar14 + uVar24);
    uVar36 = (ulong)*puVar33;
    pBVar27 = pBStack_80 + -uVar36;
    if ((((uVar9 & 0xf) == 0xf) || (*puVar33 < 8)) || (pBVar27 < dest)) goto LAB_00103b77;
    *(undefined8 *)pBStack_80 = *(undefined8 *)pBVar27;
    *(undefined8 *)(pBStack_80 + 8) = *(undefined8 *)(pBVar27 + 8);
    *(undefined2 *)(pBStack_80 + 0x10) = *(undefined2 *)(pBVar27 + 0x10);
    pBVar34 = pBStack_80 + uStack_c0 + 4;
    bVar4 = *(byte *)((long)puVar14 + uVar24 + 2);
    puVar14 = (ushort *)((long)puVar14 + uVar24 + 3);
  }
  puVar33 = (ushort *)((long)puVar1 - 0xf);
  uVar24 = 0xf;
  puVar35 = puVar14;
  if (puVar14 < puVar33) {
    uVar19 = 0;
    do {
      uVar7 = *puVar35;
      puVar35 = (ushort *)((long)puVar35 + 1);
      uVar19 = uVar19 + (byte)uVar7;
    } while (puVar35 < puVar33 && (byte)uVar7 == 0xff);
    uVar24 = (ulong)uVar19 + 0xf;
  }
  if (((puVar33 <= puVar14) || (CARRY8((ulong)pBVar34,uVar24))) ||
     (puVar14 = puVar35, CARRY8((ulong)puVar35,uVar24))) goto LAB_00103dd5;
LAB_00103b22:
  pBStack_80 = pBVar34 + uVar24;
  puVar35 = puVar14;
LAB_00103b29:
  puVar33 = (ushort *)((long)puVar35 + uVar24);
  if ((pBVar2 + -0xc < pBStack_80) || (puVar1 + -4 < puVar33)) {
    if ((puVar33 != puVar1) || (pBVar2 < pBStack_80)) goto LAB_00103dd5;
    memmove(pBVar34,puVar35,uVar24);
    puVar35 = (ushort *)(ulong)(uint)(((int)pBVar34 + (int)uVar24) - iVar10);
    goto LAB_00103ddd;
  }
  do {
    *(undefined8 *)pBVar34 = *(undefined8 *)puVar35;
    pBVar34 = pBVar34 + 8;
    puVar35 = puVar35 + 4;
  } while (pBVar34 < pBStack_80);
  uVar36 = (ulong)*puVar33;
  pBVar27 = pBStack_80 + -uVar36;
  uStack_c0 = (ulong)(uVar9 & 0xf);
LAB_00103b77:
  puVar35 = puVar33 + 1;
  if ((int)uStack_c0 == 0xf) {
    uVar9 = 0;
    do {
      uVar7 = *puVar35;
      puVar35 = (ushort *)((long)puVar35 + 1);
      uVar9 = uVar9 + (byte)uVar7;
    } while (puVar35 < puVar1 + -2 && (byte)uVar7 == 0xff);
    uStack_c0 = (ulong)uVar9 + 0xf;
    cVar18 = '\x05';
    if (puVar35 < puVar1 + -2) {
      cVar18 = CARRY8((ulong)pBStack_80,uStack_c0) * '\x05';
    }
    if (cVar18 != '\0') goto LAB_00103d28;
  }
  uStack_c0 = uStack_c0 + 4;
  pBVar13 = pBStack_80;
  goto LAB_00103bd1;
code_r0x001032e6:
  *(undefined8 *)puVar32 = *(undefined8 *)pbVar25;
  *(undefined8 *)(puVar32 + 4) = *(undefined8 *)(pbVar25 + 8);
  puVar32[8] = *(ushort *)(pbVar25 + 0x10);
  puVar33 = (ushort *)((long)puVar32 + uStack_90 + 4);
  bVar4 = *(byte *)((long)puVar21 + uVar24 + 2);
  puVar21 = (ushort *)((long)puVar21 + uVar24 + 3);
  goto LAB_00103291;
LAB_001027fa:
  puVar35 = (ushort *)(ulong)(~(uint)puVar35 + iStack_68);
LAB_00102802:
  return (int)puVar35;
LAB_00103d28:
  if (cVar18 == '\x05') {
LAB_00103dd5:
    puVar35 = (ushort *)(ulong)(~(uint)puVar35 + iStack_68);
  }
LAB_00103ddd:
  return (int)puVar35;
}

Assistant:

int LZ4_decompress_safe_usingDict(const char* source, char* dest, int compressedSize, int maxOutputSize, const char* dictStart, int dictSize)
{
    if (dictSize==0)
        return LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
    if (dictStart+dictSize == dest) {
        if (dictSize >= 64 KB - 1) {
            return LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        }
        assert(dictSize >= 0);
        return LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize, (size_t)dictSize);
    }
    assert(dictSize >= 0);
    return LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize, dictStart, (size_t)dictSize);
}